

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTcFormalTypeList::decorate_name
          (CTcFormalTypeList *this,CTcToken *decorated_name,CTcToken *func_base_name)

{
  size_t sVar1;
  char *len_00;
  CTcTokenizer *this_00;
  CTcToken *in_RDX;
  CTcToken *in_RSI;
  char *in_RDI;
  char *p;
  size_t len;
  CTcFormalTypeEle *ele;
  CTcTokenizer *in_stack_ffffffffffffffd0;
  size_t len_01;
  undefined8 *puVar2;
  
  sVar1 = CTcToken::get_text_len(in_RDX);
  for (puVar2 = *(undefined8 **)in_RDI; len_01 = sVar1 + 1, puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    if (puVar2[1] != 0) {
      len_01 = puVar2[2] + len_01;
    }
    sVar1 = len_01;
  }
  if (*(int *)(in_RDI + 0x10) != 0) {
    len_01 = sVar1 + 5;
  }
  CTcTokenizer::reserve_source((CTcTokenizer *)0x0,len_01);
  len_00 = CTcToken::get_text(in_RDX);
  CTcToken::get_text_len(in_RDX);
  this_00 = (CTcTokenizer *)
            CTcTokenizer::store_source_partial(in_stack_ffffffffffffffd0,in_RDI,(size_t)len_00);
  CTcTokenizer::store_source_partial(this_00,in_RDI,(size_t)len_00);
  for (puVar2 = *(undefined8 **)in_RDI; puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2)
  {
    if (puVar2[1] != 0) {
      CTcTokenizer::store_source_partial(this_00,in_RDI,(size_t)len_00);
    }
    CTcTokenizer::store_source_partial(this_00,in_RDI,(size_t)len_00);
  }
  if (*(int *)(in_RDI + 0x10) != 0) {
    CTcTokenizer::store_source_partial(this_00,in_RDI,(size_t)len_00);
  }
  CTcTokenizer::store_source_partial(this_00,in_RDI,(size_t)len_00);
  CTcToken::settyp(in_RSI,TOKT_SYM);
  CTcToken::set_text(in_RSI,(char *)this_00,len_01);
  return;
}

Assistant:

void CTcFormalTypeList::decorate_name(CTcToken *decorated_name,
                                      const CTcToken *func_base_name)
{
    CTcFormalTypeEle *ele;
    size_t len;
    const char *p;
    
    /* figure out how much space we need for the decorated name */
    for (len = func_base_name->get_text_len() + 1, ele = head_ ;
         ele != 0 ; ele = ele->nxt_)
    {
        /* add this type name's length, if there's a name */
        if (ele->name_ != 0)
            len += ele->name_len_;

        /* add a semicolon after the type */
        len += 1;
    }

    /* add "...;" if it's varargs */
    if (varargs_)
        len += 4;

    /* allocate space for the name */
    G_tok->reserve_source(len);

    /* start with the function name */
    p = G_tok->store_source_partial(func_base_name->get_text(),
                                    func_base_name->get_text_len());

    /* add a "*" separator for the multi-method indicator */
    G_tok->store_source_partial("*", 1);

    /* add each type name */
    for (ele = head_ ; ele != 0 ; ele = ele->nxt_)
    {
        /* add the type, if it has one (if not, leave the type empty) */
        if (ele->name_ != 0)
            G_tok->store_source_partial(ele->name_, ele->name_len_);

        /* add a semicolon to terminate the parameter name */
        G_tok->store_source_partial(";", 1);
    }

    /* add the varargs indicator ("...;"), if applicable */
    if (varargs_)
        G_tok->store_source_partial("...;", 4);

    /* null-terminate it */
    G_tok->store_source_partial("\0", 1);

    /* set the decorated token name */
    decorated_name->settyp(TOKT_SYM);
    decorated_name->set_text(p, len);
}